

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::plusSign(AffixTokenMatcherWarehouse *this)

{
  PlusSignMatcher *pPVar1;
  PlusSignMatcher local_68;
  AffixTokenMatcherWarehouse *local_10;
  AffixTokenMatcherWarehouse *this_local;
  
  local_10 = this;
  PlusSignMatcher::PlusSignMatcher(&local_68,this->fSetupData->dfs,true);
  pPVar1 = PlusSignMatcher::operator=(&this->fPlusSign,&local_68);
  PlusSignMatcher::~PlusSignMatcher(&local_68);
  return (NumberParseMatcher *)pPVar1;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::plusSign() {
    return fPlusSign = {fSetupData->dfs, true};
}